

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void __thiscall CS248::Camera::moveBy(Camera *this,double dx,double dy,double d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Vector3D *pVVar4;
  double dVar5;
  double dVar6;
  Vector3D local_28;
  
  dVar6 = d / this->screenDist;
  pVVar4 = Matrix3x3::operator[](&this->c2w,0);
  dVar5 = dx * dVar6;
  dVar1 = pVVar4->z;
  dVar6 = dVar6 * dy;
  dVar2 = pVVar4->x;
  dVar3 = pVVar4->y;
  pVVar4 = Matrix3x3::operator[](&this->c2w,1);
  local_28.x = dVar6 * pVVar4->x + dVar5 * dVar2;
  local_28.y = dVar6 * pVVar4->y + dVar5 * dVar3;
  local_28.z = dVar6 * pVVar4->z + dVar1 * dVar5;
  Vector3D::operator+=(&this->pos,&local_28);
  Vector3D::operator+=(&this->targetPos,&local_28);
  return;
}

Assistant:

void Camera::moveBy(const double dx, const double dy, const double d) {
    const double scaleFactor = d / screenDist;
    const Vector3D& displacement = c2w[0] * (dx * scaleFactor) + c2w[1] * (dy * scaleFactor);
    pos += displacement;
    targetPos += displacement;
}